

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLReaderTest_ReadSymbolicNumberOfExpr_Test::~NLReaderTest_ReadSymbolicNumberOfExpr_Test
          (NLReaderTest_ReadSymbolicNumberOfExpr_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, ReadSymbolicNumberOfExpr) {
  EXPECT_READ("c0: numberof 'a' in ('b', 42);",
              "C0\no61\n3\nh1:a\nh1:b\nn42\n");
  EXPECT_READ("c0: numberof 42 in ('b', 'c');",
              "C0\no61\n3\nn42\nh1:b\nh1:c\n");
  EXPECT_READ_ERROR("C0\no61\n0\n", "(input):19:1: too few arguments");
  EXPECT_READ_ERROR("C0\no61\n1\nx", "(input):20:1: expected expression");
}